

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.cpp
# Opt level: O0

void alListenerf(ALenum param,ALfloat value)

{
  bool bVar1;
  ALCcontext *pAVar2;
  int in_EDI;
  float in_XMM0_Da;
  lock_guard<std::mutex> _;
  ALlistener *listener;
  ContextRef context;
  memory_order __b_1;
  memory_order __b;
  mutex_type *in_stack_ffffffffffffff78;
  atomic_flag *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ALCcontext *in_stack_ffffffffffffff90;
  atomic_flag *paVar3;
  intrusive_ptr<ALCcontext> local_30;
  float local_28;
  int local_24;
  memory_order local_20;
  int local_1c;
  atomic_flag *local_18;
  memory_order local_10;
  int local_c;
  atomic_flag *local_8;
  
  local_28 = in_XMM0_Da;
  local_24 = in_EDI;
  GetContextRef();
  bVar1 = al::intrusive_ptr::operator_cast_to_bool((intrusive_ptr *)&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pAVar2 = al::intrusive_ptr<ALCcontext>::operator->(&local_30);
    al::intrusive_ptr<ALCcontext>::operator->(&local_30);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (local_24 == 0x100a) {
      if ((local_28 < 0.0) || (bVar1 = std::isfinite(local_28), !bVar1)) {
        pAVar2 = al::intrusive_ptr<ALCcontext>::operator->(&local_30);
        ALCcontext::setError(pAVar2,0xa003,"Listener gain out of range");
      }
      else {
        (pAVar2->mListener).Gain = local_28;
        al::intrusive_ptr<ALCcontext>::operator->(&local_30);
        bVar1 = std::atomic<bool>::load
                          ((atomic<bool> *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           (memory_order)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        if (bVar1) {
          paVar3 = &(pAVar2->mListener).PropsClean;
          local_c = 3;
          local_8 = paVar3;
          local_10 = std::operator&(memory_order_release,__memory_order_mask);
          if (local_c == 3) {
            (paVar3->super___atomic_flag_base)._M_i = false;
          }
          else if (local_c == 5) {
            LOCK();
            (paVar3->super___atomic_flag_base)._M_i = false;
            UNLOCK();
          }
          else {
            (paVar3->super___atomic_flag_base)._M_i = false;
          }
        }
        else {
          al::intrusive_ptr<ALCcontext>::get(&local_30);
          UpdateListenerProps(in_stack_ffffffffffffff90);
        }
      }
    }
    else if (local_24 == 0x20004) {
      if ((local_28 < 1.1754944e-38) || (3.4028235e+38 < local_28)) {
        pAVar2 = al::intrusive_ptr<ALCcontext>::operator->(&local_30);
        ALCcontext::setError(pAVar2,0xa003,"Listener meters per unit out of range");
      }
      else {
        (pAVar2->mListener).mMetersPerUnit = local_28;
        al::intrusive_ptr<ALCcontext>::operator->(&local_30);
        bVar1 = std::atomic<bool>::load
                          ((atomic<bool> *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           (memory_order)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        if (bVar1) {
          in_stack_ffffffffffffff80 = &(pAVar2->mListener).PropsClean;
          local_1c = 3;
          local_18 = in_stack_ffffffffffffff80;
          local_20 = std::operator&(memory_order_release,__memory_order_mask);
          if (local_1c == 3) {
            (in_stack_ffffffffffffff80->super___atomic_flag_base)._M_i = false;
          }
          else if (local_1c == 5) {
            LOCK();
            (in_stack_ffffffffffffff80->super___atomic_flag_base)._M_i = false;
            UNLOCK();
          }
          else {
            (in_stack_ffffffffffffff80->super___atomic_flag_base)._M_i = false;
          }
        }
        else {
          al::intrusive_ptr<ALCcontext>::get(&local_30);
          UpdateListenerProps(in_stack_ffffffffffffff90);
        }
      }
    }
    else {
      pAVar2 = al::intrusive_ptr<ALCcontext>::operator->(&local_30);
      ALCcontext::setError(pAVar2,0xa002,"Invalid listener float property");
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x15aa20);
  }
  al::intrusive_ptr<ALCcontext>::~intrusive_ptr
            ((intrusive_ptr<ALCcontext> *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

AL_API void AL_APIENTRY alListenerf(ALenum param, ALfloat value)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    ALlistener &listener = context->mListener;
    std::lock_guard<std::mutex> _{context->mPropLock};
    switch(param)
    {
    case AL_GAIN:
        if(!(value >= 0.0f && std::isfinite(value)))
            SETERR_RETURN(context, AL_INVALID_VALUE,, "Listener gain out of range");
        listener.Gain = value;
        DO_UPDATEPROPS();
        break;

    case AL_METERS_PER_UNIT:
        if(!(value >= AL_MIN_METERS_PER_UNIT && value <= AL_MAX_METERS_PER_UNIT))
            SETERR_RETURN(context, AL_INVALID_VALUE,, "Listener meters per unit out of range");
        listener.mMetersPerUnit = value;
        DO_UPDATEPROPS();
        break;

    default:
        context->setError(AL_INVALID_ENUM, "Invalid listener float property");
    }
}